

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O0

void __thiscall
cmParseJacocoCoverage::XMLParser::StartElement(XMLParser *this,string *name,char **atts)

{
  cmCTest *pcVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ostream *poVar7;
  char *pcVar8;
  mapped_type *this_00;
  reference pvVar9;
  FileLinesType *curFileLines_1;
  int local_7a8;
  int ci;
  int nr;
  int tagCount;
  vector<int,_std::allocator<int>_> *local_798;
  FileLinesType *curFileLines;
  string line;
  undefined1 local_750 [8];
  ostringstream cmCTestLog_msg_2;
  undefined1 local_5d8 [8];
  ifstream fin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  string local_390 [32];
  undefined1 local_370 [8];
  ostringstream cmCTestLog_msg_1;
  string local_1f0 [32];
  undefined1 local_1d0 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string fileName;
  char **atts_local;
  string *name_local;
  XMLParser *this_local;
  
  fileName.field_2._8_8_ = atts;
  bVar2 = std::operator==(name,"package");
  if (bVar2) {
    std::__cxx11::string::operator=
              ((string *)&this->PackageName,*(char **)(fileName.field_2._8_8_ + 8));
    std::__cxx11::string::clear();
  }
  else {
    bVar2 = std::operator==(name,"sourcefile");
    if (bVar2) {
      std::__cxx11::string::clear();
      pcVar8 = *(char **)(fileName.field_2._8_8_ + 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_40,pcVar8,&local_41);
      std::allocator<char>::~allocator(&local_41);
      uVar6 = std::__cxx11::string::empty();
      if (((uVar6 & 1) == 0) ||
         (uVar4 = (*(this->super_cmXMLParser)._vptr_cmXMLParser[0xe])(this,local_40),
         (uVar4 & 1) != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
        poVar7 = std::operator<<((ostream *)local_370,"Reading file: ");
        poVar7 = std::operator<<(poVar7,(string *)local_40);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
                     ,0x31,pcVar8,(bool)(this->Coverage->Quiet & 1));
        std::__cxx11::string::~string(local_390);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
        std::operator+(&local_3d0,&this->PackagePath,"/");
        std::operator+(&local_3b0,&local_3d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::__cxx11::string::operator=((string *)&this->FilePath,(string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_3d0);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        std::ifstream::ifstream(local_5d8,pcVar8,_S_in);
        bVar3 = std::ios::operator!((ios *)(local_5d8 +
                                           (long)*(_func_int **)((long)local_5d8 + -0x18)));
        if ((bVar3 & 1) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_750);
          poVar7 = std::operator<<((ostream *)local_750,"Jacoco Coverage: Error opening ");
          poVar7 = std::operator<<(poVar7,(string *)&this->FilePath);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->CTest;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
                       ,0x38,pcVar8,false);
          std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_750);
        }
        std::__cxx11::string::string((string *)&curFileLines);
        local_798 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](&this->Coverage->TotalCoverage,&this->FilePath);
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(local_5d8 + (long)*(_func_int **)((long)local_5d8 + -0x18)));
        if (bVar2) {
          tagCount = -1;
          std::vector<int,_std::allocator<int>_>::push_back(local_798,&tagCount);
        }
        while (bVar2 = cmsys::SystemTools::GetLineFromStream
                                 ((istream *)local_5d8,(string *)&curFileLines,(bool *)0x0,
                                  0xffffffffffffffff), bVar2) {
          nr = -1;
          std::vector<int,_std::allocator<int>_>::push_back(local_798,&nr);
        }
        std::__cxx11::string::~string((string *)&curFileLines);
        std::ifstream::~ifstream(local_5d8);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        poVar7 = std::operator<<((ostream *)local_1d0,"Cannot find file: ");
        poVar7 = std::operator<<(poVar7,(string *)&this->PackageName);
        poVar7 = std::operator<<(poVar7,"/");
        poVar7 = std::operator<<(poVar7,(string *)local_40);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
                     ,0x29,pcVar8,false);
        std::__cxx11::string::~string(local_1f0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
        this->Coverage->Error = this->Coverage->Error + 1;
      }
      std::__cxx11::string::~string((string *)local_40);
    }
    else {
      bVar2 = std::operator==(name,"line");
      if (bVar2) {
        ci = 0;
        local_7a8 = -1;
        curFileLines_1._4_4_ = -1;
        while( true ) {
          iVar5 = strcmp(*(char **)(fileName.field_2._8_8_ + (long)ci * 8),"ci");
          if (iVar5 == 0) {
            curFileLines_1._4_4_ = atoi(*(char **)(fileName.field_2._8_8_ + (long)(ci + 1) * 8));
          }
          else {
            iVar5 = strcmp(*(char **)(fileName.field_2._8_8_ + (long)ci * 8),"nr");
            if (iVar5 == 0) {
              local_7a8 = atoi(*(char **)(fileName.field_2._8_8_ + (long)(ci + 1) * 8));
            }
          }
          if ((-1 < curFileLines_1._4_4_) && (0 < local_7a8)) break;
          ci = ci + 1;
        }
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[](&this->Coverage->TotalCoverage,&this->FilePath);
        bVar2 = std::vector<int,_std::allocator<int>_>::empty(this_00);
        if (!bVar2) {
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             (this_00,(long)(local_7a8 + -1));
          *pvVar9 = curFileLines_1._4_4_;
        }
      }
    }
  }
  return;
}

Assistant:

void StartElement(const std::string& name, const char** atts) override
  {
    if (name == "package") {
      this->PackageName = atts[1];
      this->PackagePath.clear();
    } else if (name == "sourcefile") {
      this->FilePath.clear();
      std::string fileName = atts[1];

      if (this->PackagePath.empty()) {
        if (!this->FindPackagePath(fileName)) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot find file: " << this->PackageName << "/"
                                          << fileName << std::endl);
          this->Coverage.Error++;
          return;
        }
      }

      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Reading file: " << fileName << std::endl,
                         this->Coverage.Quiet);

      this->FilePath = this->PackagePath + "/" + fileName;
      cmsys::ifstream fin(this->FilePath.c_str());
      if (!fin) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Jacoco Coverage: Error opening " << this->FilePath
                                                     << std::endl);
      }
      std::string line;
      FileLinesType& curFileLines =
        this->Coverage.TotalCoverage[this->FilePath];
      if (fin) {
        curFileLines.push_back(-1);
      }
      while (cmSystemTools::GetLineFromStream(fin, line)) {
        curFileLines.push_back(-1);
      }
    } else if (name == "line") {
      int tagCount = 0;
      int nr = -1;
      int ci = -1;
      while (true) {
        if (strcmp(atts[tagCount], "ci") == 0) {
          ci = atoi(atts[tagCount + 1]);
        } else if (strcmp(atts[tagCount], "nr") == 0) {
          nr = atoi(atts[tagCount + 1]);
        }
        if (ci > -1 && nr > 0) {
          FileLinesType& curFileLines =
            this->Coverage.TotalCoverage[this->FilePath];
          if (!curFileLines.empty()) {
            curFileLines[nr - 1] = ci;
          }
          break;
        }
        ++tagCount;
      }
    }
  }